

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O1

void __thiscall
FValueTextItem::FValueTextItem
          (FValueTextItem *this,int x,int y,int height,char *text,FFont *font,EColorRange color,
          EColorRange valuecolor,FName *action,FName *values)

{
  uint uVar1;
  Node *pNVar2;
  FOptionValues *pFVar3;
  Node *pNVar4;
  long lVar5;
  ulong uVar6;
  FName local_2c;
  
  local_2c = (FName)action->Index;
  FListMenuItemSelectable::FListMenuItemSelectable
            (&this->super_FListMenuItemSelectable,x,y,height,&local_2c,-1);
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FValueTextItem_006f2d58;
  (this->mSelections).Array = (FString *)0x0;
  (this->mSelections).Most = 0;
  (this->mSelections).Count = 0;
  (this->mText).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::operator=(&this->mText,text);
  this->mFont = font;
  this->mFontColor = color;
  this->mFontColor2 = valuecolor;
  this->mSelection = 0;
  uVar1 = values->Index;
  if (uVar1 != 0) {
    pNVar2 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar1);
    do {
      pNVar4 = pNVar2;
      if ((pNVar4 == (Node *)0x0) || (pNVar4->Next == (Node *)0x1)) {
        pNVar4 = (Node *)0x0;
        break;
      }
      pNVar2 = pNVar4->Next;
    } while ((pNVar4->Pair).Key.Index != uVar1);
    if ((pNVar4 != (Node *)0x0) && (pFVar3 = (pNVar4->Pair).Value, (pFVar3->mValues).Count != 0)) {
      lVar5 = 0x10;
      uVar6 = 0;
      do {
        (*(this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem[8])
                  (this,uVar6 & 0xffffffff,
                   *(undefined8 *)((long)&((pFVar3->mValues).Array)->Value + lVar5));
        uVar6 = uVar6 + 1;
        pFVar3 = (pNVar4->Pair).Value;
        lVar5 = lVar5 + 0x18;
      } while (uVar6 < (pFVar3->mValues).Count);
    }
  }
  return;
}

Assistant:

FValueTextItem::FValueTextItem(int x, int y, int height, const char *text, FFont *font, EColorRange color, EColorRange valuecolor, FName action, FName values)
: FListMenuItemSelectable(x, y, height, action)
{
	mText = text;
	mFont = font;
	mFontColor = color;
	mFontColor2 = valuecolor;
	mSelection = 0;
	if (values != NAME_None)
	{
		FOptionValues **opt = OptionValues.CheckKey(values);
		if (opt != NULL) 
		{
			for(unsigned i=0;i<(*opt)->mValues.Size(); i++)
			{
				SetString(i, (*opt)->mValues[i].Text);
			}
		}
	}
}